

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

void __thiscall cmGeneratorExpressionDAGChecker::Initialize(cmGeneratorExpressionDAGChecker *this)

{
  bool bVar1;
  Result RVar2;
  pointer ppVar3;
  mapped_type *this_00;
  _Self local_40;
  _Self local_38;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *propSet;
  _Self local_20;
  iterator it;
  cmGeneratorExpressionDAGChecker *top;
  cmGeneratorExpressionDAGChecker *this_local;
  
  it._M_node = (_Base_ptr)Top(this);
  RVar2 = CheckGraph(this);
  this->CheckResult = RVar2;
  if ((this->CheckResult == DAG) &&
     ((((((bVar1 = EvaluatingIncludeDirectories((cmGeneratorExpressionDAGChecker *)it._M_node),
          bVar1 || (bVar1 = EvaluatingSystemIncludeDirectories
                                      ((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1)) ||
         (bVar1 = EvaluatingCompileDefinitions((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1
         )) || ((bVar1 = EvaluatingCompileOptions((cmGeneratorExpressionDAGChecker *)it._M_node),
                bVar1 || (bVar1 = EvaluatingAutoUicOptions
                                            ((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1))
               )) ||
       ((bVar1 = EvaluatingSources((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1 ||
        ((bVar1 = EvaluatingCompileFeatures((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1 ||
         (bVar1 = EvaluatingLinkOptions((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1))))))
      || ((bVar1 = EvaluatingLinkDirectories((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1
          || ((bVar1 = EvaluatingLinkDepends((cmGeneratorExpressionDAGChecker *)it._M_node), bVar1
              || (bVar1 = EvaluatingPrecompileHeaders((cmGeneratorExpressionDAGChecker *)it._M_node)
                 , bVar1)))))))) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::find((map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&it._M_node[1]._M_left,&this->Target);
    propSet = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end((map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&it._M_node[1]._M_left);
    bVar1 = std::operator!=(&local_20,(_Self *)&propSet);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_20);
      local_30 = &ppVar3->second;
      local_38._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(local_30,&this->Property);
      local_40._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_30);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (bVar1) {
        this->CheckResult = ALREADY_SEEN;
        return;
      }
    }
    this_00 = std::
              map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[]((map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)&it._M_node[1]._M_left,&this->Target);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(this_00,&this->Property);
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::Initialize()
{
  const auto* top = this->Top();
  this->CheckResult = this->CheckGraph();

#define TEST_TRANSITIVE_PROPERTY_METHOD(METHOD) top->METHOD() ||

  if (this->CheckResult == DAG &&
      (CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
        TEST_TRANSITIVE_PROPERTY_METHOD) false)) // NOLINT(*)
#undef TEST_TRANSITIVE_PROPERTY_METHOD
  {
    auto it = top->Seen.find(this->Target);
    if (it != top->Seen.end()) {
      const std::set<std::string>& propSet = it->second;
      if (propSet.find(this->Property) != propSet.end()) {
        this->CheckResult = ALREADY_SEEN;
        return;
      }
    }
    top->Seen[this->Target].insert(this->Property);
  }
}